

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaVarIterator.cpp
# Opt level: O2

void __thiscall Kernel::FormulaVarIterator::FormulaVarIterator(FormulaVarIterator *this,Term *t)

{
  this->_found = false;
  Lib::ZIArray<int>::ZIArray(&(this->_bound)._counts);
  Lib::ZIArray<int>::ZIArray(&(this->_free)._counts);
  memset(&this->_formulas,0,0xa0);
  Lib::Stack<Kernel::FormulaVarIterator::Instruction>::push(&this->_instructions,FVI_TERM);
  Lib::Stack<const_Kernel::Term_*>::push(&this->_terms,t);
  return;
}

Assistant:

FormulaVarIterator::FormulaVarIterator(const Term* t)
  : _found(false)
{
  _instructions.push(FVI_TERM);
  _terms.push(t);
}